

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::peer_list::new_connection
          (peer_list *this,peer_connection_interface *c,int session_time,torrent_state *state)

{
  short sVar1;
  undefined2 uVar2;
  _func_int **pp_Var3;
  peer_connection_interface *ppVar4;
  __type_conflict1 _Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  short *psVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type sVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  torrent_peer *this_00;
  undefined4 extraout_var_05;
  ipv6_peer *this_01;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  difference_type dVar11;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  long lVar12;
  char *pcVar13;
  address *addr_00;
  address *addr_01;
  ushort uVar14;
  undefined2 uVar15;
  _Elt_pointer pptVar16;
  char *pcVar17;
  ushort uVar18;
  string_view sVar19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  match_peer_endpoint __pred;
  address addr;
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  iterator iter;
  string i2p_dest;
  undefined1 local_198 [32];
  _Elt_pointer local_178;
  _Elt_pointer pptStack_170;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  _Elt_pointer local_158;
  _Elt_pointer pptStack_150;
  _Elt_pointer local_148;
  _Map_pointer ppptStack_140;
  _Elt_pointer local_138;
  _Elt_pointer pptStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  _Elt_pointer local_118;
  _Elt_pointer pptStack_110;
  _Elt_pointer local_108;
  _Map_pointer ppptStack_100;
  aux local_f8 [32];
  const_iterator local_d8;
  _Elt_pointer local_b8;
  _Elt_pointer pptStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  _Elt_pointer local_98;
  _Elt_pointer pptStack_90;
  _Elt_pointer local_88;
  _Map_pointer ppptStack_80;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_78;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_58;
  undefined4 extraout_var_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_12;
  
  iter._M_last = (_Elt_pointer)0x0;
  iter._M_node = (_Map_pointer)0x0;
  iter._M_cur = (_Elt_pointer)0x0;
  iter._M_first = (_Elt_pointer)0x0;
  iVar7 = (**c->_vptr_peer_connection_interface)(c);
  ::std::__cxx11::string::string((string *)&i2p_dest,(string *)CONCAT44(extraout_var,iVar7));
  if ((i2p_dest._M_string_length == 0 & state->allow_multiple_connections_per_ip) == 1) {
    iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
    psVar9 = (short *)CONCAT44(extraout_var_00,iVar7);
    if (*psVar9 != 2) {
      addr.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(psVar9 + 4);
      addr.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(psVar9 + 8);
      addr.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(psVar9 + 0xc);
      addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      addr.ipv4_address_.addr_.s_addr = *(in4_addr_type *)(psVar9 + 2);
      addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      addr.ipv6_address_.scope_id_ = 0;
    }
    addr.type_ = (uint)(*psVar9 != 2);
    find_peers(&range,this,&addr);
    local_58._M_cur = range.first._M_cur;
    local_58._M_first = range.first._M_first;
    local_58._M_last = range.first._M_last;
    local_58._M_node = range.first._M_node;
    local_78._M_cur = range.second._M_cur;
    local_78._M_first = range.second._M_first;
    local_78._M_last = range.second._M_last;
    local_78._M_node = range.second._M_node;
    __pred.m_port = psVar9[1] << 8 | (ushort)psVar9[1] >> 8;
    __pred.m_addr = &addr;
    __pred._10_6_ = 0;
    ::std::
    find_if<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
              ((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                *)local_198,&local_58,&local_78,__pred);
    iter._M_last = (_Elt_pointer)local_198._16_8_;
    iter._M_node = (_Map_pointer)local_198._24_8_;
    iter._M_cur = (_Elt_pointer)local_198._0_8_;
    iter._M_first = (_Elt_pointer)local_198._8_8_;
    pptVar16 = (_Elt_pointer)local_198._0_8_;
    if ((_Elt_pointer)local_198._0_8_ == range.second._M_cur) goto LAB_00259a1b;
LAB_0025989b:
    this_00 = *pptVar16;
    if ((this_00->connection != (peer_connection_interface *)0x0) &&
       (iVar7 = (*c->_vptr_peer_connection_interface[0x11])(c,4), (char)iVar7 != '\0')) {
      if (i2p_dest._M_string_length == 0) {
        iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
        psVar9 = (short *)CONCAT44(extraout_var_04,iVar7);
        if (*psVar9 != 2) {
          addr.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(psVar9 + 4);
          addr.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(psVar9 + 8);
          addr.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(psVar9 + 0xc);
          addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          addr.ipv4_address_.addr_.s_addr = *(in4_addr_type *)(psVar9 + 2);
          addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
          addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          addr.ipv6_address_.scope_id_ = 0;
        }
        addr.type_ = (uint)(*psVar9 != 2);
        print_address_abi_cxx11_((string *)&range,(aux *)&addr,addr_00);
        pptVar16 = range.first._M_cur;
        torrent_peer::address(this_00);
        print_address_abi_cxx11_((string *)local_198,local_f8,addr_01);
        (*c->_vptr_peer_connection_interface[0x12])
                  (c,4,"DUPLICATE PEER","this: \"%s\" that: \"%s\"",pptVar16,local_198._0_8_);
        ::std::__cxx11::string::~string((string *)local_198);
        ::std::__cxx11::string::~string((string *)&range);
      }
      else {
        (*c->_vptr_peer_connection_interface[0x12])
                  (c,4,"DUPLICATE PEER","destination: \"%s\"",i2p_dest._M_dataplus._M_p);
      }
    }
    if ((this_00->field_0x1e & 8) != 0) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&range,peer_banned,(type *)0x0);
      (*c->_vptr_peer_connection_interface[4])(c,&range,1,0);
      goto LAB_0025a1a4;
    }
    if (this_00->connection != (peer_connection_interface *)0x0) {
      pp_Var3 = this_00->connection->_vptr_peer_connection_interface;
      if (i2p_dest._M_string_length == 0) {
        iVar7 = (*pp_Var3[2])();
        (*c->_vptr_peer_connection_interface[3])(&range,c);
        bVar6 = boost::asio::ip::detail::operator==
                          ((endpoint *)CONCAT44(extraout_var_10,iVar7),(endpoint *)&range);
        if (!bVar6) {
          (*this_00->connection->_vptr_peer_connection_interface[3])(&addr);
          iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
          _Var5 = boost::asio::ip::detail::operator==
                            ((endpoint *)&addr,(endpoint *)CONCAT44(extraout_var_11,iVar7));
          goto LAB_00259db8;
        }
LAB_00259dbc:
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&range,self_connection,(type *)0x0);
        (*c->_vptr_peer_connection_interface[4])(c,&range,1);
        ppVar4 = this_00->connection;
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&range,self_connection,(type *)0x0);
        (*ppVar4->_vptr_peer_connection_interface[4])(ppVar4,&range,1);
      }
      else {
        iVar7 = (*pp_Var3[1])();
        _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(extraout_var_09,iVar7),&i2p_dest);
LAB_00259db8:
        if (_Var5 != false) goto LAB_00259dbc;
        iVar7 = (*this_00->connection->_vptr_peer_connection_interface[10])();
        iVar8 = (*c->_vptr_peer_connection_interface[10])(c);
        if ((char)iVar7 == (char)iVar8) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&range,duplicate_peer_id,(type *)0x0);
          (*c->_vptr_peer_connection_interface[4])(c,&range,1,0);
        }
        else if (i2p_dest._M_string_length == 0) {
          iVar7 = (*c->_vptr_peer_connection_interface[10])(c);
          if ((char)iVar7 == '\0') {
            (*c->_vptr_peer_connection_interface[3])(&addr,c);
            uVar15 = addr.type_._2_2_;
            iVar8 = (*this_00->connection->_vptr_peer_connection_interface[2])();
            lVar12 = CONCAT44(extraout_var_14,iVar8);
          }
          else {
            (*this_00->connection->_vptr_peer_connection_interface[3])(&range);
            uVar15 = range.first._M_cur._2_2_;
            iVar8 = (*c->_vptr_peer_connection_interface[2])(c);
            lVar12 = CONCAT44(extraout_var_13,iVar8);
          }
          uVar14 = uVar15 << 8 | (ushort)uVar15 >> 8;
          uVar2 = *(ushort *)(lVar12 + 2);
          uVar18 = uVar2 << 8 | (ushort)uVar2 >> 8;
          bVar6 = uVar14 < uVar18;
          if ((char)iVar7 != '\0') {
            bVar6 = uVar14 >= uVar18 && uVar14 != uVar18;
          }
          if (bVar6) {
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (uVar15 == uVar2) {
              lVar12 = random((aux *)0x1);
              bVar6 = (int)lVar12 == 0;
            }
          }
          iVar7 = (*this_00->connection->_vptr_peer_connection_interface[0xe])();
          iVar8 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
          if ((char)iVar8 != '\0') {
            pcVar17 = "no";
            pcVar13 = "yes";
            if (bVar6 || (char)iVar7 != '\0') {
              pcVar13 = "no";
              pcVar17 = "yes";
            }
            (*c->_vptr_peer_connection_interface[0x12])
                      (c,4,"DUPLICATE_PEER_RESOLUTION","our: %d other: %d disconnecting: %s",
                       (ulong)uVar14,(ulong)uVar18,pcVar13);
            (*this_00->connection->_vptr_peer_connection_interface[0x12])
                      (this_00->connection,4,"DUPLICATE_PEER_RESOLUTION",
                       "our: %d other: %d disconnecting: %s",(ulong)uVar14,(ulong)uVar18,pcVar17);
          }
          if (bVar6 || (char)iVar7 != '\0') {
            this->m_locked_peer = this_00;
            ppVar4 = this_00->connection;
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)&range,duplicate_peer_id,(type *)0x0);
            (*ppVar4->_vptr_peer_connection_interface[4])(ppVar4,&range,1,0);
            goto LAB_0025a10f;
          }
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&range,duplicate_peer_id,(type *)0x0);
          (*c->_vptr_peer_connection_interface[4])(c,&range,1,0);
        }
        else {
          iVar7 = (**this_00->connection->_vptr_peer_connection_interface)();
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_12,iVar7);
          iVar7 = (*c->_vptr_peer_connection_interface[10])(c);
          if ((char)iVar7 == '\0') {
            bVar6 = false;
          }
          else {
            bVar6 = ::std::operator>(&i2p_dest,__rhs);
          }
          iVar7 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
          if ((char)iVar7 != '\0') {
            pcVar17 = "yes";
            pcVar13 = "no";
            if (bVar6 != false) {
              pcVar13 = "yes";
              pcVar17 = "no";
            }
            (*c->_vptr_peer_connection_interface[0x12])
                      (c,4,"DUPLICATE_PEER_RESOLUTION","our: %s other: %s disconnecting: %s",
                       i2p_dest._M_dataplus._M_p,(__rhs->_M_dataplus)._M_p,pcVar13);
            (*this_00->connection->_vptr_peer_connection_interface[0x12])
                      (this_00->connection,4,"DUPLICATE_PEER_RESOLUTION",
                       "our: %s other: %s disconnecting: %s",(__rhs->_M_dataplus)._M_p,
                       i2p_dest._M_dataplus._M_p,pcVar17);
          }
          if (bVar6 == false) {
            this->m_locked_peer = this_00;
            ppVar4 = this_00->connection;
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)&range,duplicate_peer_id,(type *)0x0);
            (*ppVar4->_vptr_peer_connection_interface[4])(ppVar4,&range,1,0);
LAB_0025a10f:
            this->m_locked_peer = (torrent_peer *)0x0;
            goto LAB_0025a117;
          }
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&range,duplicate_peer_id,(type *)0x0);
          (*c->_vptr_peer_connection_interface[4])(c,&range,1,0);
        }
      }
      goto LAB_0025a1a4;
    }
LAB_0025a117:
    bVar6 = is_connect_candidate(this,this_00);
    if (bVar6) {
      iVar7 = 1;
      if (1 < this->m_num_connect_candidates) {
        iVar7 = this->m_num_connect_candidates;
      }
      this->m_num_connect_candidates = iVar7 + -1;
    }
  }
  else {
    if (i2p_dest._M_string_length == 0) {
      local_118 = (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptStack_110 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_108 = (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppptStack_100 =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_138 = (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pptStack_130 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_128 = *(undefined4 *)
                   &(this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last;
      uStack_124 = *(undefined4 *)
                    ((long)&(this->m_peers).
                            super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            .
                            super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
      uStack_120 = *(undefined4 *)
                    &(this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
      uStack_11c = *(undefined4 *)
                    ((long)&(this->m_peers).
                            super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            .
                            super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
      iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
      psVar9 = (short *)CONCAT44(extraout_var_01,iVar7);
      if (*psVar9 != 2) {
        addr.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(psVar9 + 4);
        addr.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(psVar9 + 8);
        addr.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(psVar9 + 0xc);
        addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        addr.ipv4_address_.addr_.s_addr = *(in4_addr_type *)(psVar9 + 2);
        addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        addr.ipv6_address_.scope_id_ = 0;
      }
      addr.type_ = (uint)(*psVar9 != 2);
      ::std::
      lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,libtorrent::aux::peer_address_compare>
                (&range,&local_118,&local_138);
      pptVar16 = range.first._M_cur;
      iter._M_last = range.first._M_last;
      iter._M_node = range.first._M_node;
      iter._M_cur = range.first._M_cur;
      iter._M_first = range.first._M_first;
      if (range.first._M_cur !=
          (this->m_peers).
          super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          .
          super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        torrent_peer::address(*range.first._M_cur);
        iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
        psVar9 = (short *)CONCAT44(extraout_var_02,iVar7);
        if (*psVar9 != 2) {
          addr.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(psVar9 + 4);
          addr.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(psVar9 + 8);
          addr.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(psVar9 + 0xc);
          addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          addr.ipv4_address_.addr_.s_addr = *(in4_addr_type *)(psVar9 + 2);
          addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
          addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          addr.ipv6_address_.scope_id_ = 0;
        }
        addr.type_ = (uint)(*psVar9 != 2);
        bVar6 = boost::asio::ip::operator==((address *)&range,&addr);
        if (bVar6) goto LAB_0025989b;
      }
    }
    else {
      local_98 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptStack_90 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_88 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppptStack_80 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_b8 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pptStack_b0 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_a8 = *(undefined4 *)
                  &(this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last;
      uStack_a4 = *(undefined4 *)
                   ((long)&(this->m_peers).
                           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           .
                           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
      uStack_a0 = *(undefined4 *)
                   &(this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
      uStack_9c = *(undefined4 *)
                   ((long)&(this->m_peers).
                           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           .
                           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
      ::std::
      lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,std::__cxx11::string,libtorrent::aux::peer_address_compare>
                (&range);
      iter._M_last = range.first._M_last;
      iter._M_node = range.first._M_node;
      iter._M_cur = range.first._M_cur;
      iter._M_first = range.first._M_first;
      if ((range.first._M_cur !=
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur) &&
         (((*range.first._M_cur)->field_0x1e & 2) != 0)) {
        sVar19 = torrent_peer::dest(*range.first._M_cur);
        __y._M_str = i2p_dest._M_dataplus._M_p;
        __y._M_len = i2p_dest._M_string_length;
        bVar6 = ::std::operator==(sVar19,__y);
        pptVar16 = iter._M_cur;
        if (bVar6) goto LAB_0025989b;
      }
    }
LAB_00259a1b:
    if ((state->max_peerlist_size != 0) &&
       (sVar10 = ::std::
                 deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         *)this), state->max_peerlist_size <= (int)sVar10)) {
      erase_peers(this,state,(erase_peer_flags_t)0x2);
      sVar10 = ::std::
               deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)this);
      if ((int)sVar10 < state->max_peerlist_size) {
        local_158 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptStack_150 = (this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
        local_148 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppptStack_140 =
             (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
        local_178 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptStack_170 = (this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first;
        local_168 = *(undefined4 *)
                     &(this->m_peers).
                      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      .
                      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last;
        uStack_164 = *(undefined4 *)
                      ((long)&(this->m_peers).
                              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              .
                              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
        uStack_160 = *(undefined4 *)
                      &(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node;
        uStack_15c = *(undefined4 *)
                      ((long)&(this->m_peers).
                              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              .
                              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
        iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
        psVar9 = (short *)CONCAT44(extraout_var_03,iVar7);
        if (*psVar9 != 2) {
          addr.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(psVar9 + 4);
          addr.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(psVar9 + 8);
          addr.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(psVar9 + 0xc);
          addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          addr.ipv4_address_.addr_.s_addr = *(in4_addr_type *)(psVar9 + 2);
          addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
          addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          addr.ipv6_address_.scope_id_ = 0;
        }
        addr.type_ = (uint)(*psVar9 != 2);
        ::std::
        lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,libtorrent::aux::peer_address_compare>
                  (&range,&local_158,&local_178);
        iter._M_last = range.first._M_last;
        iter._M_node = range.first._M_node;
        iter._M_cur = range.first._M_cur;
        iter._M_first = range.first._M_first;
        goto LAB_00259b53;
      }
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&range,too_many_connections,(type *)0x0);
      (*c->_vptr_peer_connection_interface[4])(c,&range,1,0);
LAB_0025a1a4:
      bVar6 = false;
      goto LAB_0025a1a6;
    }
LAB_00259b53:
    if (i2p_dest._M_string_length != 0) {
      sVar19._M_str = i2p_dest._M_dataplus._M_p;
      sVar19._M_len = i2p_dest._M_string_length;
      this_00 = add_i2p_peer(this,sVar19,(peer_source_flags_t)0x20,(pex_flags_t)0x0,state);
      goto LAB_0025a117;
    }
    iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
    sVar1 = *(short *)CONCAT44(extraout_var_05,iVar7);
    iVar7 = (**this->m_peer_allocator->_vptr_torrent_peer_allocator_interface)
                      (this->m_peer_allocator,(ulong)(sVar1 != 2));
    this_01 = (ipv6_peer *)CONCAT44(extraout_var_06,iVar7);
    if (this_01 == (ipv6_peer *)0x0) goto LAB_0025a1a4;
    if (sVar1 == 2) {
      iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
      ipv4_peer::ipv4_peer
                ((ipv4_peer *)this_01,(endpoint *)CONCAT44(extraout_var_08,iVar7),false,
                 (peer_source_flags_t)0x0);
    }
    else {
      iVar7 = (*c->_vptr_peer_connection_interface[2])(c);
      ipv6_peer::ipv6_peer
                (this_01,(endpoint *)CONCAT44(extraout_var_07,iVar7),false,(peer_source_flags_t)0x0)
      ;
    }
    local_d8._M_cur = iter._M_cur;
    local_d8._M_first = iter._M_first;
    local_d8._M_last = iter._M_last;
    local_d8._M_node = iter._M_node;
    addr._0_8_ = this_01;
    ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::insert(&range.first,
             (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              *)this,&local_d8,(value_type *)&addr);
    iter._M_last = range.first._M_last;
    iter._M_node = range.first._M_node;
    iter._M_cur = range.first._M_cur;
    iter._M_first = range.first._M_first;
    iVar7 = this->m_round_robin;
    range.first._M_cur =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    range.first._M_first =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    range.first._M_last =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    range.first._M_node =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    dVar11 = ::std::operator-(&iter,&range.first);
    if (dVar11 <= iVar7) {
      this->m_round_robin = this->m_round_robin + 1;
    }
    this_00 = *iter._M_cur;
    *(uint *)&this_00->field_0x1b = *(uint *)&this_00->field_0x1b & 0xff81ffff | 0x400000;
  }
  (*c->_vptr_peer_connection_interface[9])(c,this_00);
  (*c->_vptr_peer_connection_interface[0xb])
            (c,(ulong)this_00->prev_amount_download << 10,(ulong)this_00->prev_amount_upload << 10);
  this_00->prev_amount_upload = 0;
  this_00->prev_amount_download = 0;
  this_00->connection = c;
  iVar7 = (*c->_vptr_peer_connection_interface[0xc])(c);
  bVar6 = true;
  if ((char)iVar7 == '\0') {
    this_00->last_connected = (uint16_t)session_time;
  }
LAB_0025a1a6:
  ::std::__cxx11::string::~string((string *)&i2p_dest);
  return bVar6;
}

Assistant:

bool peer_list::new_connection(peer_connection_interface& c, int session_time
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
//		TORRENT_ASSERT(!c.is_outgoing());

		INVARIANT_CHECK;

		iterator iter;
		torrent_peer* i = nullptr;

#if TORRENT_USE_I2P
		std::string const i2p_dest = c.destination();
#else
		std::string const i2p_dest;
#endif

		bool found = false;
		// this check doesn't support i2p peers
		if (state->allow_multiple_connections_per_ip && i2p_dest.empty())
		{
			auto const& remote = c.remote();
			auto const addr = remote.address();
			auto const range = find_peers(addr);
			iter = std::find_if(range.first, range.second, match_peer_endpoint(addr, remote.port()));

			if (iter != range.second)
			{
				TORRENT_ASSERT((*iter)->in_use);
				found = true;
			}
		}
		else
		{
#if TORRENT_USE_I2P
			if (!i2p_dest.empty())
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, i2p_dest, peer_address_compare()
					);

				if (iter != m_peers.end() && (*iter)->is_i2p_addr && (*iter)->dest() == i2p_dest)
				{
					TORRENT_ASSERT((*iter)->in_use);
					found = true;
				}
			}
			else
#endif
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, c.remote().address(), peer_address_compare()
					);

				if (iter != m_peers.end() && (*iter)->address() == c.remote().address())
				{
					TORRENT_ASSERT((*iter)->in_use);
					found = true;
				}
			}
		}

		// make sure the iterator we got is properly sorted relative
		// to the connection's address
//		TORRENT_ASSERT(m_peers.empty()
//			|| (iter == m_peers.end() && (*(iter-1))->address() < c.remote().address())
//			|| (iter != m_peers.end() && c.remote().address() < (*iter)->address())
//			|| (iter != m_peers.end() && iter != m_peers.begin() && (*(iter-1))->address() < c.remote().address()));

		if (found)
		{
			i = *iter;
			TORRENT_ASSERT(i->in_use);
			TORRENT_ASSERT(i->connection != &c);
			TORRENT_ASSERT(i->address() == c.remote().address());

#ifndef TORRENT_DISABLE_LOGGING
			if (i->connection != nullptr && c.should_log(peer_log_alert::info))
			{
#if TORRENT_USE_I2P
				if (!i2p_dest.empty())
				{
					c.peer_log(peer_log_alert::info, "DUPLICATE PEER", "destination: \"%s\""
						, i2p_dest.c_str());
				}
				else
#endif
				{
					c.peer_log(peer_log_alert::info, "DUPLICATE PEER", "this: \"%s\" that: \"%s\""
						, print_address(c.remote().address()).c_str()
						, print_address(i->address()).c_str());
				}
			}
#endif
			if (i->banned)
			{
				c.disconnect(errors::peer_banned, operation_t::bittorrent);
				return false;
			}

			if (i->connection != nullptr)
			{
				bool self_connection = false;
#if TORRENT_USE_I2P
				if (!i2p_dest.empty())
				{
					self_connection = i->connection->local_i2p_endpoint() == i2p_dest;
				}
				else
#endif
				{
					self_connection = i->connection->remote() == c.local_endpoint()
					|| i->connection->local_endpoint() == c.remote();
				}

				if (self_connection)
				{
					c.disconnect(errors::self_connection, operation_t::bittorrent, peer_connection_interface::failure);
					TORRENT_ASSERT(i->connection->peer_info_struct() == i);
					i->connection->disconnect(errors::self_connection, operation_t::bittorrent, peer_connection_interface::failure);
					TORRENT_ASSERT(i->connection == nullptr);
					return false;
				}

				TORRENT_ASSERT(i->connection != &c);
				// the new connection is a local (outgoing) connection
				// or the current one is already connected
				if (i->connection->is_outgoing() == c.is_outgoing())
				{
					// if the other end connected to us both times, just drop
					// the second one. Or if we made both connections.
					c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					return false;
				}
#if TORRENT_USE_I2P
				else if (!i2p_dest.empty())
				{
					// duplicate connection resolution for i2p connections is
					// simple. The smaller address takes priority for making the
					// outgoing connection

					std::string const& other_dest = i->connection->destination();

					// decide which peer connection to disconnect
					// if the ports are equal, pick on at random
					bool disconnect1 = c.is_outgoing() && i2p_dest > other_dest;

#ifndef TORRENT_DISABLE_LOGGING
					if (c.should_log(peer_log_alert::info))
					{
						c.peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %s other: %s disconnecting: %s"
							, i2p_dest.c_str(), other_dest.c_str(), disconnect1 ? "yes" : "no");
						i->connection->peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %s other: %s disconnecting: %s"
							, other_dest.c_str(), i2p_dest.c_str(), disconnect1 ? "no" : "yes");
					}
#endif

					if (disconnect1)
					{
						c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return false;
					}
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = i;
					i->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
				}
#endif
				else
				{
					// at this point, we need to disconnect either
					// i->connection or c. In order for both this client
					// and the client on the other end to decide to
					// disconnect the same one, we need a consistent rule to
					// select which one.

					bool const outgoing1 = c.is_outgoing();

					// for this, we compare our ports and whoever has the lower port
					// should be the one keeping its outgoing connection. Since
					// outgoing ports are selected at random by the OS, we need to
					// be careful to only look at the target end of a connection for
					// the endpoint.

					int const our_port = outgoing1 ? i->connection->local_endpoint().port() : c.local_endpoint().port();
					int const other_port = outgoing1 ? c.remote().port() : i->connection->remote().port();

					// decide which peer connection to disconnect
					// if the ports are equal, pick on at random
					bool disconnect1 = ((our_port < other_port) && !outgoing1)
						|| ((our_port > other_port) && outgoing1)
						|| ((our_port == other_port) && random(1));
					disconnect1 &= !i->connection->failed();

#ifndef TORRENT_DISABLE_LOGGING
					if (c.should_log(peer_log_alert::info))
					{
						c.peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %d other: %d disconnecting: %s"
							, our_port, other_port, disconnect1 ? "yes" : "no");
						i->connection->peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %d other: %d disconnecting: %s"
							, our_port, other_port, disconnect1 ? "no" : "yes");
					}
#endif

					if (disconnect1)
					{
						c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return false;
					}
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = i;
					i->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
				}
			}

			if (is_connect_candidate(*i))
				update_connect_candidates(-1);
		}